

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O3

void __thiscall QtMWidgets::AbstractScrollArea::_q_animateScrollIndicators(AbstractScrollArea *this)

{
  int *piVar1;
  int iVar2;
  ScrollIndicator *pSVar3;
  ScrollIndicator *pSVar4;
  AbstractScrollAreaPrivate *pAVar5;
  
  pAVar5 = (this->d).d;
  iVar2 = pAVar5->animationAlphaDelta;
  pSVar3 = pAVar5->horIndicator;
  pSVar3->alpha = pSVar3->alpha - iVar2;
  pSVar4 = pAVar5->vertIndicator;
  piVar1 = &pSVar4->alpha;
  *piVar1 = *piVar1 - iVar2;
  if (pSVar3->alpha < 1) {
    AbstractScrollAreaPrivate::stopScrollIndicatorsAnimation(pAVar5);
  }
  else if ((pSVar3->needPaint != false) || (pSVar4->needPaint == true)) {
    QTimer::start((int)pAVar5->animationTimer);
  }
  pAVar5 = (this->d).d;
  if (pAVar5->horIndicator->needPaint == true) {
    QWidget::update();
    pAVar5 = (this->d).d;
  }
  if (pAVar5->vertIndicator->needPaint == true) {
    QWidget::update();
    return;
  }
  return;
}

Assistant:

void
AbstractScrollArea::_q_animateScrollIndicators()
{
	d->horIndicator->alpha -= d->animationAlphaDelta;
	d->vertIndicator->alpha -= d->animationAlphaDelta;

	if( d->horIndicator->alpha <= 0 )
		d->stopScrollIndicatorsAnimation();
	else if( d->horIndicator->needPaint || d->vertIndicator->needPaint )
		d->animationTimer->start( d->animationTimeout );

	if( d->horIndicator->needPaint )
		d->horIndicator->update();

	if( d->vertIndicator->needPaint )
		d->vertIndicator->update();
}